

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBseparate16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  uint32_t uVar4;
  long lVar5;
  bool bVar6;
  
  lVar2 = (long)fromskew * 2;
  while (bVar6 = h != 0, h = h - 1, bVar6) {
    lVar5 = 0;
    lVar3 = (long)toskew * -4;
    uVar4 = w;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      puVar1 = img->Bitdepth16To8;
      *(uint *)((long)cp + lVar5 * 2) =
           CONCAT12(puVar1[*(ushort *)(b + lVar5)],
                    CONCAT11(puVar1[*(ushort *)(g + lVar5)],puVar1[*(ushort *)(r + lVar5)])) |
           0xff000000;
      lVar3 = lVar3 + -4;
      lVar5 = lVar5 + 2;
    }
    r = r + lVar5 + lVar2;
    g = g + lVar5 + lVar2;
    b = b + lVar5 + lVar2;
    cp = (uint32_t *)((long)cp - lVar3);
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBseparate16bittile)
{
    uint16_t *wr = (uint16_t *)r;
    uint16_t *wg = (uint16_t *)g;
    uint16_t *wb = (uint16_t *)b;
    (void)img;
    (void)y;
    (void)a;
    for (; h > 0; --h)
    {
        for (x = 0; x < w; x++)
            *cp++ = PACK(img->Bitdepth16To8[*wr++], img->Bitdepth16To8[*wg++],
                         img->Bitdepth16To8[*wb++]);
        SKEW(wr, wg, wb, fromskew);
        cp += toskew;
    }
}